

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O2

void __thiscall higan::Thread::~Thread(Thread *this)

{
  LogLevel LVar1;
  Logger local_328;
  Fmt local_110;
  
  if ((this->started == true) && (this->joined == false)) {
    LVar1 = Logger::GetLogLevel();
    if ((int)LVar1 < 2) {
      Logger::Logger(&local_328,INFO,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/Thread.cpp"
                     ,0x37,"~Thread");
      Fmt::Fmt(&local_110,"detach thread: %s",(this->name_)._M_dataplus._M_p);
      Logger::operator<<(&local_328,&local_110);
      Logger::~Logger(&local_328);
    }
    pthread_detach(this->thread_);
  }
  std::_Function_base::~_Function_base(&(this->function_).super__Function_base);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Thread::~Thread()
{
	/**
	 * 当线程未已经启动且未被Join detach线程继续运行 否则直接退出
	 */
	if (started && !joined)
	{
		LOG_INFO << higan::Fmt("detach thread: %s", name_.c_str());
		pthread_detach(thread_);
	}
}